

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O0

void __thiscall TCLAP::SwitchArg::commonProcessing(SwitchArg *this)

{
  undefined8 uVar1;
  long *in_RDI;
  string *in_stack_00000060;
  string *in_stack_00000068;
  CmdLineParseException *in_stack_00000070;
  Arg *in_stack_ffffffffffffff20;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined1 local_60 [96];
  
  if ((*(byte *)((long)in_RDI + 0xa1) & 1) != 0) {
    uVar1 = __cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    (**(code **)(*in_RDI + 0x38))(local_60);
    CmdLineParseException::CmdLineParseException
              (in_stack_00000070,in_stack_00000068,in_stack_00000060);
    __cxa_throw(uVar1,&CmdLineParseException::typeinfo,CmdLineParseException::~CmdLineParseException
               );
  }
  if ((*(byte *)((long)in_RDI + 0x91) & 1) != 0) {
    uVar1 = __cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    (**(code **)(*in_RDI + 0x38))(&stack0xffffffffffffff50);
    CmdLineParseException::CmdLineParseException
              (in_stack_00000070,in_stack_00000068,in_stack_00000060);
    __cxa_throw(uVar1,&CmdLineParseException::typeinfo,CmdLineParseException::~CmdLineParseException
               );
  }
  *(undefined1 *)((long)in_RDI + 0x91) = 1;
  if ((*(byte *)((long)in_RDI + 0xa3) & 1) == 1) {
    *(undefined1 *)((long)in_RDI + 0xa3) = 0;
  }
  else {
    *(undefined1 *)((long)in_RDI + 0xa3) = 1;
  }
  Arg::_checkWithVisitor(in_stack_ffffffffffffff20);
  return;
}

Assistant:

inline void SwitchArg::commonProcessing()
{
	if ( _xorSet )
		throw(CmdLineParseException(
		      "Mutually exclusive argument already set!", toString()));

	if ( _alreadySet ) 
		throw(CmdLineParseException("Argument already set!", toString()));

	_alreadySet = true;

	if ( _value == true )
		_value = false;
	else
		_value = true;

	_checkWithVisitor();
}